

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall tonk::OutgoingQueue::PushAndGetFreshBuffer(OutgoingQueue *this)

{
  int iVar1;
  pthread_mutex_t *ppVar2;
  int iVar3;
  uint8_t *puVar4;
  OutgoingQueueCommon *pOVar5;
  undefined8 *puVar6;
  undefined8 *in_RSI;
  Locker locker;
  
  puVar4 = (uint8_t *)in_RSI[1];
  if (puVar4 != (uint8_t *)0x0) {
    iVar1 = *(int *)(puVar4 + 8);
    if (iVar1 == 0) goto LAB_0012bb34;
    ppVar2 = (pthread_mutex_t *)*in_RSI;
    iVar3 = pthread_mutex_lock(ppVar2);
    if (iVar3 != 0) goto LAB_0012bb96;
    pktalloc::Allocator::Shrink((Allocator *)&ppVar2[1].__data,puVar4,iVar1 + 0x3f);
    if (ppVar2 != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(ppVar2);
    }
    puVar6 = in_RSI + 2;
    if ((undefined8 *)in_RSI[3] != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)in_RSI[3];
    }
    *puVar6 = in_RSI[1];
    in_RSI[3] = in_RSI[1];
  }
  ppVar2 = (pthread_mutex_t *)*in_RSI;
  iVar1 = *(int *)((long)ppVar2 + 500);
  iVar3 = pthread_mutex_lock(ppVar2);
  if (iVar3 != 0) {
LAB_0012bb96:
    std::__throw_system_error(iVar3);
  }
  puVar4 = pktalloc::Allocator::Allocate((Allocator *)&ppVar2[1].__data,iVar1 + 0x18);
  if (ppVar2 != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(ppVar2);
  }
  in_RSI[1] = puVar4;
  if (puVar4 == (uint8_t *)0x0) {
    pOVar5 = (OutgoingQueueCommon *)operator_new(0x38);
    (pOVar5->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__align =
         (long)"Out of memory";
    *(undefined1 **)
     ((long)&(pOVar5->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex + 8) =
         (undefined1 *)
         ((long)&(pOVar5->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex +
         0x18);
    *(undefined8 *)
     ((long)&(pOVar5->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex + 0x10)
         = 0;
    (pOVar5->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__size[0x18] =
         '\0';
    *(undefined4 *)&(pOVar5->WriteAllocator).Allocator.HugeChunkStart = 0;
    (pOVar5->WriteAllocator).Allocator.PreferredWindows.PreallocatedData[0] = (WindowHeader *)0x10;
    this->Common = pOVar5;
    return (Result)(ErrorResult *)this;
  }
  puVar4[0] = '\0';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[8] = '\0';
  puVar4[9] = '\0';
  puVar4[10] = '\0';
  puVar4[0xb] = '\0';
  puVar4[0xc] = '\0';
  puVar4[0xd] = '\0';
  puVar4[0xe] = '\0';
  puVar4[0xf] = '\0';
LAB_0012bb34:
  this->Common = (OutgoingQueueCommon *)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result OutgoingQueue::PushAndGetFreshBuffer()
{
    if (OutBuffer)
    {
        // If there was no data written yet:
        if (OutBuffer->NextWriteOffset <= 0) {
            return Result::Success();
        }

        const unsigned neededBytes = OutBuffer->NextWriteOffset + kAllocatedOverheadBytes;

        // Reduce memory usage
        Common->WriteAllocator.Shrink(OutBuffer,
            neededBytes);

        // Link at end of list (After NewestQueued)
        if (NewestQueued) {
            NewestQueued->Next = OutBuffer;
        }
        else {
            OldestQueued = OutBuffer;
        }
        NewestQueued = OutBuffer;
        TONK_DEBUG_ASSERT(OutBuffer->Next == nullptr);

        TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Flushed OutBuffer = ", OutBuffer);
    }

    OutBuffer = (OutgoingQueuedDatagram*)Common->WriteAllocator.Allocate(
        kQueueHeaderBytes + Common->UDPMaxDatagramBytes);

    if (!OutBuffer) {
        return Result::OutOfMemory();
    }

    OutBuffer->Initialize();

    TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Created new OutBuffer = ", OutBuffer);

    return Result::Success();
}